

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_read(int hdl,void *buffer,long nbytes)

{
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  int local_4;
  
  if (memTable[in_EDI].fitsfilesize < (long)(memTable[in_EDI].currentpos + in_RDX)) {
    local_4 = 0x6b;
  }
  else {
    memcpy(in_RSI,*memTable[in_EDI].memaddrptr + memTable[in_EDI].currentpos,in_RDX);
    memTable[in_EDI].currentpos = in_RDX + memTable[in_EDI].currentpos;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mem_read(int hdl, void *buffer, long nbytes)
/*
  read bytes from the current position in the file
*/
{
    if (memTable[hdl].currentpos + nbytes > memTable[hdl].fitsfilesize)
        return(END_OF_FILE);

    memcpy(buffer,
           *(memTable[hdl].memaddrptr) + memTable[hdl].currentpos,
           nbytes);

    memTable[hdl].currentpos += nbytes;
    return(0);
}